

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboTestUtil.cpp
# Opt level: O2

char * deqp::gles3::Functional::FboTestUtil::getFormatName(deUint32 format)

{
  char *pcVar1;
  TestError *this;
  
  switch(format) {
  case 0x8229:
    pcVar1 = "r8";
    break;
  case 0x822a:
  case 0x822c:
switchD_01130389_caseD_8d8a:
    this = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this,"Unknown format",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboTestUtil.cpp"
               ,0x3e0);
    __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  case 0x822b:
    pcVar1 = "rg8";
    break;
  case 0x822d:
    pcVar1 = "r16f";
    break;
  case 0x822e:
    pcVar1 = "r32f";
    break;
  case 0x822f:
    pcVar1 = "rg16f";
    break;
  case 0x8230:
    pcVar1 = "rg32f";
    break;
  case 0x8231:
    pcVar1 = "r8i";
    break;
  case 0x8232:
    pcVar1 = "r8ui";
    break;
  case 0x8233:
    pcVar1 = "r16i";
    break;
  case 0x8234:
    pcVar1 = "r16ui";
    break;
  case 0x8235:
    pcVar1 = "r32i";
    break;
  case 0x8236:
    pcVar1 = "r32ui";
    break;
  case 0x8237:
    pcVar1 = "rg8i";
    break;
  case 0x8238:
    pcVar1 = "rg8ui";
    break;
  case 0x8239:
    pcVar1 = "rg16i";
    break;
  case 0x823a:
    pcVar1 = "rg16ui";
    break;
  case 0x823b:
    pcVar1 = "rg32i";
    break;
  case 0x823c:
    pcVar1 = "rg32ui";
    break;
  default:
    switch(format) {
    case 0x8d70:
      pcVar1 = "rgba32ui";
      break;
    case 0x8d71:
      pcVar1 = "rgb32ui";
      break;
    case 0x8d72:
    case 0x8d73:
    case 0x8d74:
    case 0x8d75:
    case 0x8d78:
    case 0x8d79:
    case 0x8d7a:
    case 0x8d7b:
    case 0x8d7e:
    case 0x8d7f:
    case 0x8d80:
    case 0x8d81:
      goto switchD_01130389_caseD_8d8a;
    case 0x8d76:
      pcVar1 = "rgba16ui";
      break;
    case 0x8d77:
      pcVar1 = "rgb16ui";
      break;
    case 0x8d7c:
      pcVar1 = "rgba8ui";
      break;
    case 0x8d7d:
      pcVar1 = "rgb8ui";
      break;
    case 0x8d82:
      pcVar1 = "rgba32i";
      break;
    case 0x8d83:
      pcVar1 = "rgb32i";
      break;
    default:
      switch(format) {
      case 0x8051:
        pcVar1 = "rgb8";
        break;
      case 0x8052:
      case 0x8053:
      case 0x8054:
      case 0x8055:
        goto switchD_01130389_caseD_8d8a;
      case 0x8056:
        pcVar1 = "rgba4";
        break;
      case 0x8057:
        pcVar1 = "rgb5_a1";
        break;
      case 0x8058:
        pcVar1 = "rgba8";
        break;
      case 0x8059:
        pcVar1 = "rgb10_a2";
        break;
      default:
        switch(format) {
        case 0x8814:
          pcVar1 = "rgba32f";
          break;
        case 0x8815:
          pcVar1 = "rgb32f";
          break;
        case 0x8816:
        case 0x8817:
        case 0x8818:
        case 0x8819:
          goto switchD_01130389_caseD_8d8a;
        case 0x881a:
          pcVar1 = "rgba16f";
          break;
        case 0x881b:
          pcVar1 = "rgb16f";
          break;
        default:
          switch(format) {
          case 0x8c3a:
            pcVar1 = "r11f_g11f_b10f";
            break;
          case 0x8c3b:
          case 0x8c3c:
          case 0x8c3e:
          case 0x8c3f:
          case 0x8c40:
          case 0x8c42:
            goto switchD_01130389_caseD_8d8a;
          case 0x8c3d:
            pcVar1 = "rgb9_e5";
            break;
          case 0x8c41:
            pcVar1 = "srgb8";
            break;
          case 0x8c43:
            pcVar1 = "srgb8_alpha8";
            break;
          default:
            switch(format) {
            case 0x8d88:
              pcVar1 = "rgba16i";
              break;
            case 0x8d89:
              pcVar1 = "rgb16i";
              break;
            case 0x8d8a:
            case 0x8d8b:
            case 0x8d8c:
            case 0x8d8d:
              goto switchD_01130389_caseD_8d8a;
            case 0x8d8e:
              pcVar1 = "rgba8i";
              break;
            case 0x8d8f:
              pcVar1 = "rgb8i";
              break;
            default:
              switch(format) {
              case 0x8f94:
                pcVar1 = "r8_snorm";
                break;
              case 0x8f95:
                pcVar1 = "rg8_snorm";
                break;
              case 0x8f96:
                pcVar1 = "rgb8_snorm";
                break;
              case 0x8f97:
                pcVar1 = "rgba8_snorm";
                break;
              default:
                if (format == 0x81a5) {
                  pcVar1 = "depth_component16";
                }
                else if (format == 0x81a6) {
                  pcVar1 = "depth_component24";
                }
                else if (format == 0x88f0) {
                  pcVar1 = "depth24_stencil8";
                }
                else if (format == 0x8cac) {
                  pcVar1 = "depth_component32f";
                }
                else if (format == 0x8cad) {
                  pcVar1 = "depth32f_stencil8";
                }
                else if (format == 0x8d48) {
                  pcVar1 = "stencil_index8";
                }
                else if (format == 0x8d62) {
                  pcVar1 = "rgb565";
                }
                else {
                  if (format != 0x906f) goto switchD_01130389_caseD_8d8a;
                  pcVar1 = "rgb10_a2ui";
                }
              }
            }
          }
        }
      }
    }
  }
  return pcVar1;
}

Assistant:

const char* getFormatName (deUint32 format)
{
	switch (format)
	{
		case GL_RGB565:				return "rgb565";
		case GL_RGB5_A1:			return "rgb5_a1";
		case GL_RGBA4:				return "rgba4";
		case GL_DEPTH_COMPONENT16:	return "depth_component16";
		case GL_STENCIL_INDEX8:		return "stencil_index8";
		case GL_RGBA32F:			return "rgba32f";
		case GL_RGBA32I:			return "rgba32i";
		case GL_RGBA32UI:			return "rgba32ui";
		case GL_RGBA16F:			return "rgba16f";
		case GL_RGBA16I:			return "rgba16i";
		case GL_RGBA16UI:			return "rgba16ui";
		case GL_RGBA8:				return "rgba8";
		case GL_RGBA8I:				return "rgba8i";
		case GL_RGBA8UI:			return "rgba8ui";
		case GL_SRGB8_ALPHA8:		return "srgb8_alpha8";
		case GL_RGB10_A2:			return "rgb10_a2";
		case GL_RGB10_A2UI:			return "rgb10_a2ui";
		case GL_RGBA8_SNORM:		return "rgba8_snorm";
		case GL_RGB8:				return "rgb8";
		case GL_R11F_G11F_B10F:		return "r11f_g11f_b10f";
		case GL_RGB32F:				return "rgb32f";
		case GL_RGB32I:				return "rgb32i";
		case GL_RGB32UI:			return "rgb32ui";
		case GL_RGB16F:				return "rgb16f";
		case GL_RGB16I:				return "rgb16i";
		case GL_RGB16UI:			return "rgb16ui";
		case GL_RGB8_SNORM:			return "rgb8_snorm";
		case GL_RGB8I:				return "rgb8i";
		case GL_RGB8UI:				return "rgb8ui";
		case GL_SRGB8:				return "srgb8";
		case GL_RGB9_E5:			return "rgb9_e5";
		case GL_RG32F:				return "rg32f";
		case GL_RG32I:				return "rg32i";
		case GL_RG32UI:				return "rg32ui";
		case GL_RG16F:				return "rg16f";
		case GL_RG16I:				return "rg16i";
		case GL_RG16UI:				return "rg16ui";
		case GL_RG8:				return "rg8";
		case GL_RG8I:				return "rg8i";
		case GL_RG8UI:				return "rg8ui";
		case GL_RG8_SNORM:			return "rg8_snorm";
		case GL_R32F:				return "r32f";
		case GL_R32I:				return "r32i";
		case GL_R32UI:				return "r32ui";
		case GL_R16F:				return "r16f";
		case GL_R16I:				return "r16i";
		case GL_R16UI:				return "r16ui";
		case GL_R8:					return "r8";
		case GL_R8I:				return "r8i";
		case GL_R8UI:				return "r8ui";
		case GL_R8_SNORM:			return "r8_snorm";
		case GL_DEPTH_COMPONENT32F:	return "depth_component32f";
		case GL_DEPTH_COMPONENT24:	return "depth_component24";
		case GL_DEPTH32F_STENCIL8:	return "depth32f_stencil8";
		case GL_DEPTH24_STENCIL8:	return "depth24_stencil8";

		default:
			TCU_FAIL("Unknown format");
	}
}